

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

uchar __thiscall ON_SubDDisplayParameters::EncodeAsUnsignedChar(ON_SubDDisplayParameters *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = this->m_display_density;
  if ((((bVar1 == 4 || 6 < bVar1) &&
       ((this->m_bDisplayDensityIsAbsolute == false) == !Default.m_bDisplayDensityIsAbsolute)) &&
      (Default.m_bControlNetMesh == this->m_bControlNetMesh)) &&
     (Default.m_bComputeCurvature == this->m_bComputeCurvature)) {
    return '\0';
  }
  bVar2 = 0x84;
  if (bVar1 < 7) {
    bVar2 = bVar1 | 0x80;
  }
  return this->m_bComputeCurvature << 5 |
         (this->m_bDisplayDensityIsAbsolute & 1U) << 4 | this->m_bControlNetMesh << 3 | bVar2;
}

Assistant:

unsigned char ON_SubDDisplayParameters::EncodeAsUnsignedChar() const
{
  const unsigned char max_display_density = ((unsigned char)ON_SubDDisplayParameters::MaximumDensity);
  const unsigned char default_display_density = ((unsigned char)ON_SubDDisplayParameters::DefaultDensity);
  unsigned char encoded_parameters;
  if (
    (default_display_density == m_display_density || m_display_density > max_display_density)
    && ON_SubDDisplayParameters::Default.DisplayDensityIsAdaptive() == DisplayDensityIsAdaptive()
    && ON_SubDDisplayParameters::Default.MeshLocation() == MeshLocation()
    && ON_SubDDisplayParameters::Default.ComputeCurvature() == ComputeCurvature()
    )
  {
    // use defaults
    encoded_parameters = 0;
  }
  else
  {
    const unsigned char density
      = (m_display_density <= max_display_density)
      ? m_display_density
      : default_display_density
      ;

    const unsigned char density_as_char = (density & ON_SubDDisplayParameters::subd_mesh_density_mask);

    const unsigned char location
      = (ON_SubDComponentLocation::ControlNet == MeshLocation())
      ? ON_SubDDisplayParameters::subd_mesh_location_bit
      : 0;

    const unsigned char absoute_density_as_char
      = m_bDisplayDensityIsAbsolute
      ? ON_SubDDisplayParameters::subd_mesh_absolute_density_bit
      : 0;

    const unsigned char compute_curvature_as_char
      = m_bComputeCurvature
      ? ON_SubDDisplayParameters::subd_mesh_compute_curvature_bit
      : 0;

    const unsigned char nondefault_settings = ON_SubDDisplayParameters::subd_mesh_nondefault_bit;

    encoded_parameters
      = nondefault_settings
      | density_as_char
      | absoute_density_as_char
      | compute_curvature_as_char
      | location
      ;
  }
  return encoded_parameters;
}